

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O2

size_t embree::sse2::createMortonCodeArray<embree::Instance>
                 (Instance *mesh,mvector<BVHBuilderMorton::BuildPrim> *morton,
                 BuildProgressMonitor *progressMonitor)

{
  unsigned_long *puVar1;
  undefined1 auVar2 [16];
  char cVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  runtime_error *prVar7;
  size_t sVar8;
  ulong last;
  unsigned_long last_00;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar15;
  float fVar16;
  undefined1 in_XMM2 [16];
  undefined1 auVar14 [16];
  float fVar17;
  undefined1 in_XMM3 [16];
  task_group_context *in_stack_fffffffffffffa48;
  size_t taskCount;
  unsigned_long *local_5a8;
  unsigned_long local_5a0;
  anon_class_16_2_ed117de8_conflict11 local_598;
  Instance **local_588;
  undefined1 local_580 [8];
  unsigned_long *local_578;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_570;
  undefined1 local_560 [8];
  MortonCodeMapping mapping_1;
  Instance *mesh_local;
  anon_class_8_1_898bcfc2_conflict11 local_520;
  MortonCodeMapping mapping;
  pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> cb;
  pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> cb_empty;
  task_group_context context;
  long alStack_230 [64];
  
  mapping_1.base.field_0._0_8_ = &mesh_local;
  puVar1 = (unsigned_long *)morton->size_active;
  cb_empty.first = 0;
  cb_empty.second.lower.field_0._0_8_ = 0x7f8000007f800000;
  cb_empty.second.lower.field_0._8_8_ = 0x7f8000007f800000;
  cb_empty.second.upper.field_0._0_8_ = 0xff800000ff800000;
  cb_empty.second.upper.field_0._8_8_ = 0xff800000ff800000;
  mesh_local = mesh;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  mapping.base.field_0._8_8_ = 0;
  mapping.scale.field_0._0_8_ = 0x400;
  local_580 = (undefined1  [8])&local_598;
  local_578 = (unsigned_long *)&mapping_1;
  mapping.base.field_0._0_8_ = puVar1;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>,embree::sse2::createMortonCodeArray<embree::Instance>(embree::Instance*,embree::vector_t<embree::sse2::BVHBuilderMorton::BuildPrim,embree::aligned_monitored_allocator<embree::sse2::BVHBuilderMorton::BuildPrim,8ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::sse2::createMortonCodeArray<embree::Instance>(embree::Instance*,embree::vector_t<embree::sse2::BVHBuilderMorton::BuildPrim,embree::aligned_monitored_allocator<embree::sse2::BVHBuilderMorton::BuildPrim,8ul>>&,embree::BuildProgressMonitor&)::_lambda(std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>const&,std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,std::pair<unsigned_long,embree::BBox<embree::Vec3fa>>const&,embree::sse2::___embree::BBox<embree::Vec3fa>>const__std__pair<unsigned_long,embree::BBox<embree::Vec3fa>>const___1_>
            (&cb,(d1 *)&mapping,(blocked_range<unsigned_long> *)&cb_empty,
             (pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> *)local_580,
             (anon_class_16_2_ed117de8_conflict11 *)local_580,(anon_class_1_0_00000001 *)&context,
             in_stack_fffffffffffffa48);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar3 != '\0') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"task cancelled");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  if ((unsigned_long *)cb.first == puVar1) {
    fVar9 = cb.second.upper.field_0.m128[0] - cb.second.lower.field_0.m128[0];
    fVar10 = cb.second.upper.field_0.m128[1] - cb.second.lower.field_0.m128[1];
    fVar11 = cb.second.upper.field_0.m128[2] - cb.second.lower.field_0.m128[2];
    fVar12 = cb.second.upper.field_0.m128[3] - cb.second.lower.field_0.m128[3];
    auVar2._4_4_ = fVar10;
    auVar2._0_4_ = fVar9;
    auVar2._8_4_ = fVar11;
    auVar2._12_4_ = fVar12;
    auVar14 = rcpps(in_XMM2,auVar2);
    fVar13 = auVar14._0_4_;
    fVar15 = auVar14._4_4_;
    fVar16 = auVar14._8_4_;
    fVar17 = auVar14._12_4_;
    mapping.scale.field_0.i[2] =
         (uint)(((1.0 - fVar11 * fVar16) * fVar16 + fVar16) * 1013.76) & -(uint)(1e-19 < fVar11);
    mapping.scale.field_0.i[3] =
         (uint)(((1.0 - fVar12 * fVar17) * fVar17 + fVar17) * 1013.76) & -(uint)(1e-19 < fVar12);
    mapping.scale.field_0.i[1] =
         (uint)(((1.0 - fVar10 * fVar15) * fVar15 + fVar15) * 1013.76) & -(uint)(1e-19 < fVar10);
    mapping.scale.field_0.i[0] =
         (uint)(((1.0 - fVar9 * fVar13) * fVar13 + fVar13) * 1013.76) & -(uint)(1e-19 < fVar9);
    mapping_1.base.field_0._0_8_ = &mapping;
    mapping_1.base.field_0._8_8_ = morton;
    mapping_1.scale.field_0._0_8_ = &mesh_local;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_578 = (unsigned_long *)0x0;
    local_570._0_8_ = 0x400;
    local_598.reduction = (anon_class_1_0_00000001 *)&mapping_1;
    local_580 = (undefined1  [8])puVar1;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::createMortonCodeArray<embree::Instance>(embree::Instance*,embree::vector_t<embree::sse2::BVHBuilderMorton::BuildPrim,embree::aligned_monitored_allocator<embree::sse2::BVHBuilderMorton::BuildPrim,8ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::range<unsigned_long>const&)_2_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::createMortonCodeArray<embree::Instance>(embree::Instance*,embree::vector_t<embree::sse2::BVHBuilderMorton::BuildPrim,embree::aligned_monitored_allocator<embree::sse2::BVHBuilderMorton::BuildPrim,8ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::range<unsigned_long>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)local_580,(anon_class_8_1_898bcfc2 *)&local_598,
               &context);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar3 != '\0') {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"task cancelled");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
  }
  else {
    fVar9 = cb.second.upper.field_0.m128[0] - cb.second.lower.field_0.m128[0];
    fVar10 = cb.second.upper.field_0.m128[1] - cb.second.lower.field_0.m128[1];
    fVar11 = cb.second.upper.field_0.m128[2] - cb.second.lower.field_0.m128[2];
    fVar12 = cb.second.upper.field_0.m128[3] - cb.second.lower.field_0.m128[3];
    auVar14._4_4_ = fVar10;
    auVar14._0_4_ = fVar9;
    auVar14._8_4_ = fVar11;
    auVar14._12_4_ = fVar12;
    auVar14 = rcpps(in_XMM3,auVar14);
    fVar13 = auVar14._0_4_;
    fVar15 = auVar14._4_4_;
    fVar16 = auVar14._8_4_;
    fVar17 = auVar14._12_4_;
    mapping_1.scale.field_0.i[2] =
         (uint)(((1.0 - fVar11 * fVar16) * fVar16 + fVar16) * 1013.76) & -(uint)(1e-19 < fVar11);
    mapping_1.scale.field_0.i[3] =
         (uint)(((1.0 - fVar12 * fVar17) * fVar17 + fVar17) * 1013.76) & -(uint)(1e-19 < fVar12);
    mapping_1.scale.field_0.i[1] =
         (uint)(((1.0 - fVar10 * fVar15) * fVar15 + fVar15) * 1013.76) & -(uint)(1e-19 < fVar10);
    mapping_1.scale.field_0.i[0] =
         (uint)(((1.0 - fVar9 * fVar13) * fVar13 + fVar13) * 1013.76) & -(uint)(1e-19 < fVar9);
    local_598.reduction = (anon_class_1_0_00000001 *)&mapping_1;
    local_5a0 = 0;
    local_5a8 = puVar1;
    local_598.func = (anon_class_8_1_898ec2eb *)morton;
    local_588 = &mesh_local;
    iVar4 = tbb::detail::d1::max_concurrency();
    uVar5 = (long)puVar1 + 0x3ffU >> 10;
    last = (long)iVar4;
    if (uVar5 <= (ulong)(long)iVar4) {
      last = uVar5;
    }
    if (0x3f < last) {
      last = 0x40;
    }
    local_570._0_8_ = &taskCount;
    local_580 = (undefined1  [8])&local_5a0;
    local_578 = (unsigned_long *)&local_5a8;
    local_560 = (undefined1  [8])&local_598;
    taskCount = last;
    local_570._8_8_ = &context;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&mapping,(context_traits)0x4,CUSTOM_CTX);
    local_520.func = (anon_class_40_5_11684cf9_conflict2 *)local_580;
    tbb::detail::d1::
    parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43)>
              (0,last,1,&local_520,(task_group_context *)&mapping);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&mapping);
    if (cVar3 != '\0') {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"task cancelled");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&mapping);
    lVar6 = 0;
    for (sVar8 = 0; taskCount != sVar8; sVar8 = sVar8 + 1) {
      alStack_230[sVar8] = lVar6;
      lVar6 = lVar6 + *(long *)(context.padding + sVar8 * 8 + -0x48);
    }
    local_598.reduction = (anon_class_1_0_00000001 *)&mapping_1;
    local_5a0 = 0;
    local_5a8 = puVar1;
    local_598.func = (anon_class_8_1_898ec2eb *)morton;
    local_588 = &mesh_local;
    iVar4 = tbb::detail::d1::max_concurrency();
    if ((ulong)(long)iVar4 < uVar5) {
      uVar5 = (long)iVar4;
    }
    last_00 = 0x40;
    if (uVar5 < 0x40) {
      last_00 = uVar5;
    }
    local_580 = (undefined1  [8])&local_5a0;
    local_578 = (unsigned_long *)&local_5a8;
    local_570._0_8_ = &taskCount;
    local_560 = (undefined1  [8])&local_598;
    taskCount = last_00;
    local_570._8_8_ = &context;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&mapping,(context_traits)0x4,CUSTOM_CTX);
    local_520.func = (anon_class_40_5_11684cf9_conflict2 *)local_580;
    tbb::detail::d1::
    parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43)>
              (0,last_00,1,&local_520,(task_group_context *)&mapping);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&mapping);
    if (cVar3 != '\0') {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"task cancelled");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&mapping);
    lVar6 = 0;
    for (sVar8 = 0; taskCount != sVar8; sVar8 = sVar8 + 1) {
      alStack_230[sVar8] = lVar6;
      lVar6 = lVar6 + *(long *)(context.padding + sVar8 * 8 + -0x48);
    }
  }
  return cb.first;
}

Assistant:

size_t createMortonCodeArray(Mesh* mesh, mvector<BVHBuilderMorton::BuildPrim>& morton, BuildProgressMonitor& progressMonitor)
    {
      size_t numPrimitives = morton.size();

      /* compute scene bounds */
      std::pair<size_t,BBox3fa> cb_empty(0,empty);
      auto cb = parallel_reduce 
        ( size_t(0), numPrimitives, size_t(1024), cb_empty, [&](const range<size_t>& r) -> std::pair<size_t,BBox3fa>
          {
            size_t num = 0;
            BBox3fa bounds = empty;
            
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa prim_bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&prim_bounds))) continue;
              bounds.extend(center2(prim_bounds));
              num++;
            }
            return std::make_pair(num,bounds);
          }, [] (const std::pair<size_t,BBox3fa>& a, const std::pair<size_t,BBox3fa>& b) {
          return std::make_pair(a.first + b.first,merge(a.second,b.second)); 
        });
      
      
      size_t numPrimitivesGen = cb.first;
      const BBox3fa centBounds = cb.second;
      
      /* compute morton codes */
      if (likely(numPrimitivesGen == numPrimitives))
      {
        /* fast path if all primitives were valid */
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_for( size_t(0), numPrimitives, size_t(1024), [&](const range<size_t>& r) -> void {
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
              generator(mesh->bounds(j),unsigned(j));
          });
      }
      else
      {
        /* slow path, fallback in case some primitives were invalid */
        ParallelPrefixSumState<size_t> pstate;
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&bounds))) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());
        
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[base]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (!mesh->buildBounds(j,&bounds)) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());          
      }
      return numPrimitivesGen;
    }